

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigOutDec.c
# Opt level: O2

Aig_Man_t * Saig_ManDecPropertyOutput(Aig_Man_t *pAig,int nLits,int fVerbose)

{
  char *__s;
  uint uVar1;
  Vec_Ptr_t *p;
  Aig_Man_t *p_00;
  size_t sVar2;
  char *__dest;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Vec_Int_t *p_01;
  ulong uVar6;
  Aig_Obj_t *p1;
  int iVar7;
  int i;
  int i_00;
  ulong uVar8;
  
  p = Saig_ManFindPrimes(pAig,nLits,fVerbose);
  p_00 = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  __s = pAig->pName;
  iVar7 = 0;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(__s);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p_00->nConstrs = pAig->nConstrs;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (; iVar7 < pAig->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,iVar7);
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
  }
  for (iVar7 = 0; iVar7 < pAig->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar7);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      if (((ulong)pAVar4 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
      }
      uVar6 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pAVar4->pFanin1 & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      pAVar5 = Aig_And(p_00,pAVar5,p1);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  for (iVar7 = 0; iVar7 < pAig->nTruePos; iVar7 = iVar7 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar7);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    Aig_ObjCreateCo(p_00,pAVar4);
  }
  if (p != (Vec_Ptr_t *)0x0) {
    iVar7 = p->nSize;
    i_00 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; i_00 != iVar7; i_00 = i_00 + 1) {
      p_01 = (Vec_Int_t *)Vec_PtrEntry(p,i_00);
      pAVar4 = p_00->pConst1;
      for (i = 0; i < p_01->nSize; i = i + 1) {
        uVar1 = Vec_IntEntry(p_01,i);
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        if (pAig->vObjs == (Vec_Ptr_t *)0x0) {
          pvVar3 = (void *)0x0;
        }
        else {
          pvVar3 = Vec_PtrEntry(pAig->vObjs,uVar1 >> 1);
        }
        if (((ulong)pvVar3 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x13e,"Aig_Obj_t *Aig_ObjCopy(Aig_Obj_t *)");
        }
        pAVar4 = Aig_And(p_00,pAVar4,
                         (Aig_Obj_t *)((ulong)(uVar1 & 1) ^ *(ulong *)((long)pvVar3 + 0x28)));
      }
      Aig_ObjCreateCo(p_00,pAVar4);
    }
  }
  for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar7);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    Aig_ObjCreateCo(p_00,pAVar4);
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,pAig->nRegs);
  if (p != (Vec_Ptr_t *)0x0) {
    uVar8 = 0;
    uVar6 = (ulong)(uint)p->nSize;
    if (p->nSize < 1) {
      uVar6 = uVar8;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      if ((Vec_Ptr_t *)p->pArray[uVar8] != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree((Vec_Ptr_t *)p->pArray[uVar8]);
      }
    }
    Vec_PtrFree(p);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManDecPropertyOutput( Aig_Man_t * pAig, int nLits, int fVerbose )
{
    Aig_Man_t * pAigNew = NULL;
    Aig_Obj_t * pObj, * pMiter;
    Vec_Ptr_t * vPrimes;
    Vec_Int_t * vCube;
    int i, k, Lit;

    // compute primes of the comb output function
    vPrimes = Saig_ManFindPrimes( pAig, nLits, fVerbose );

    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create original POs of the circuit
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // create prime POs of the circuit
    if ( vPrimes )
    Vec_PtrForEachEntry( Vec_Int_t *, vPrimes, vCube, k )
    {
        pMiter = Aig_ManConst1( pAigNew );
        Vec_IntForEachEntry( vCube, Lit, i )
        {
            pObj = Aig_NotCond( Aig_ObjCopy(Aig_ManObj(pAig, Abc_Lit2Var(Lit))), Abc_LitIsCompl(Lit) );
            pMiter = Aig_And( pAigNew, pMiter, pObj );
        }
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );

    Vec_VecFreeP( (Vec_Vec_t **)&vPrimes );
    return pAigNew;
}